

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_writer_add_mem_ex
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32)

{
  mz_zip_internal_state *pArray;
  mz_uint16 method;
  mz_uint16 mVar1;
  undefined1 uVar2;
  mz_bool mVar3;
  mz_uint mVar4;
  tdefl_status tVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  ulong uVar11;
  mz_uint64 mVar12;
  uint level;
  undefined8 uVar13;
  mz_uint64 mVar14;
  mz_uint16 dos_date_00;
  undefined4 uStack_b8;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  mz_uint32 ext_attributes;
  tdefl_compressor *d;
  tdefl_compressor *ptVar15;
  mz_uint64 local_a0;
  ulong local_90;
  mz_uint16 local_88;
  void *local_78;
  time_t cur_time;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined2 local_4c;
  undefined8 local_48;
  ulong local_40;
  void *local_38;
  
  dos_time = 0;
  dos_date = 0;
  uVar9 = 6;
  if (-1 < (int)level_and_flags) {
    uVar9 = level_and_flags;
  }
  level = uVar9 & 0xf;
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (pArray == (mz_zip_internal_state *)0x0) {
    return 0;
  }
  if (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) {
    return 0;
  }
  if (pArchive_name == (char *)0x0) {
    return 0;
  }
  if (pBuf == (void *)0x0 && buf_size != 0) {
    return 0;
  }
  if (pComment == (void *)0x0 && comment_size != 0) {
    return 0;
  }
  if (10 < level) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  uVar9 = uVar9 & 0x400;
  local_78 = (void *)uncomp_size;
  uVar11 = uncomp_size | buf_size;
  if (uVar11 >> 0x20 != 0) {
    return 0;
  }
  if (uncomp_size != 0 && uVar9 == 0) {
    return 0;
  }
  mVar12 = pZip->m_archive_size;
  local_38 = pComment;
  mVar3 = mz_zip_writer_validate_archive_name(pArchive_name);
  if (mVar3 == 0) {
    return 0;
  }
  time(&cur_time);
  mz_zip_time_t_to_dos_time(cur_time,&dos_time,&dos_date);
  sVar6 = strlen(pArchive_name);
  if (0xffff < sVar6) {
    return 0;
  }
  if (pZip->m_total_files == 0xffff) {
    return 0;
  }
  mVar4 = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);
  uVar8 = (ulong)mVar4;
  local_40 = (ulong)comment_size;
  if (pZip->m_archive_size + uVar8 + local_40 + sVar6 + 0x4c >> 0x20 != 0) {
    return 0;
  }
  uVar13 = 0;
  if ((sVar6 != 0) && (pArchive_name[sVar6 - 1] == '/')) {
    if (uVar11 != 0) {
      return 0;
    }
    uVar13 = 0x10;
  }
  uVar11 = (pArray->m_central_dir).m_size + local_40 + sVar6 + 0x2e;
  if ((((pArray->m_central_dir).m_capacity < uVar11) &&
      (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar11,1), mVar3 == 0)) ||
     ((uVar11 = (pArray->m_central_dir_offsets).m_size + 1, local_48 = uVar13,
      (pArray->m_central_dir_offsets).m_capacity < uVar11 &&
      (mVar3 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar11,1),
      mVar3 == 0)))) {
    return 0;
  }
  bVar10 = level == 0 | (byte)(uVar9 >> 10);
  uStack_b8 = CONCAT13(bVar10,(undefined3)uStack_b8);
  if (buf_size == 0 || bVar10 != 0) {
    d = (tdefl_compressor *)0x0;
  }
  else {
    d = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
    if (d == (tdefl_compressor *)0x0) {
      return 0;
    }
  }
  mVar3 = mz_zip_writer_write_zeros(pZip,mVar12,(mz_uint32)(uVar8 + 0x1e));
  ptVar15 = d;
  if (mVar3 != 0) {
    mVar14 = uVar8 + mVar12;
    if ((pZip->m_file_offset_alignment != 0) &&
       (((uint)mVar14 & pZip->m_file_offset_alignment - 1) != 0)) {
      __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/contrib/zip/src/miniz.h"
                    ,0x16e0,
                    "mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive *, const char *, const void *, size_t, const void *, mz_uint16, mz_uint, mz_uint64, mz_uint32)"
                   );
    }
    mVar12 = uVar8 + 0x1e + mVar12;
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar12,pArchive_name,sVar6);
    ptVar15 = d;
    if (sVar7 != sVar6) goto LAB_00395ab7;
    mVar12 = mVar12 + sVar6;
    if (uVar9 == 0) {
      local_90 = mz_crc32(0,(mz_uint8 *)pBuf,buf_size);
      ptVar15 = d;
      local_78 = (void *)buf_size;
      if ((3 < buf_size & (bVar10 ^ 1)) != 0) {
        local_58 = 0;
        cur_time = (time_t)pZip;
        local_60 = mVar12;
        mVar4 = tdefl_create_comp_flags_from_zip_params(level,-0xf,0);
        ptVar15 = d;
        tdefl_init(d,mz_zip_writer_add_put_buf_callback,&cur_time,mVar4);
        tVar5 = tdefl_compress_buffer(d,pBuf,buf_size,TDEFL_FINISH);
        if (tVar5 != TDEFL_STATUS_DONE) {
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptVar15);
          return 0;
        }
        local_a0 = local_60;
        mVar12 = 8;
        uVar11 = local_58;
        goto LAB_00395b39;
      }
    }
    else {
      local_90 = (ulong)uncomp_crc32;
    }
    sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar12,pBuf,buf_size);
    if (sVar7 == buf_size) {
      local_a0 = mVar12 + buf_size;
      mVar12 = (mz_uint64)(uVar9 >> 7);
      uVar11 = buf_size;
LAB_00395b39:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptVar15);
      mVar1 = dos_time;
      method = dos_date;
      ext_attributes = (mz_uint32)ptVar15;
      if (uVar11 >> 0x20 != 0) {
        return 0;
      }
      if (local_a0 >> 0x20 == 0) {
        uVar2 = 0x14;
        if ((short)mVar12 == 0) {
          uVar2 = 0;
        }
        cur_time = (time_t)CONCAT14(uVar2,0x4034b50);
        local_60 = CONCAT17((char)(local_90 >> 8),
                            CONCAT16((char)local_90,
                                     CONCAT15((char)(dos_date >> 8),
                                              CONCAT14((char)dos_date,
                                                       CONCAT13((char)(dos_time >> 8),
                                                                CONCAT12((char)dos_time,
                                                                         (short)mVar12))))));
        local_58 = CONCAT17((char)((ulong)local_78 >> 8),
                            CONCAT16((char)local_78,
                                     CONCAT15((char)(uVar11 >> 0x18),
                                              CONCAT14((char)(uVar11 >> 0x10),
                                                       CONCAT13((char)(uVar11 >> 8),
                                                                CONCAT12((char)uVar11,
                                                                         (short)(local_90 >> 0x10)))
                                                      ))));
        local_50 = (undefined1)((ulong)local_78 >> 0x10);
        local_4f = (undefined1)((ulong)local_78 >> 0x18);
        local_4e = (undefined1)sVar6;
        local_4d = (undefined1)(sVar6 >> 8);
        local_4c = 0;
        dos_date_00 = 0x5c25;
        sVar7 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar14,&cur_time,0x1e);
        if (sVar7 == 0x1e) {
          local_88 = (mz_uint16)sVar6;
          mVar3 = mz_zip_writer_add_to_central_dir
                            (pZip,pArchive_name,local_88,local_38,(mz_uint16)local_40,local_78,
                             (mz_uint16)uVar11,local_90,mVar12,(uint)mVar1,method,(mz_uint16)mVar14,
                             (mz_uint16)local_48,dos_date_00,
                             CONCAT26(dos_time,CONCAT24(dos_date,uStack_b8)),ext_attributes);
          if (mVar3 != 0) {
            pZip->m_total_files = pZip->m_total_files + 1;
            pZip->m_archive_size = local_a0;
            return 1;
          }
          return 0;
        }
        return 0;
      }
      return 0;
    }
  }
LAB_00395ab7:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptVar15);
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive *pZip,
                                 const char *pArchive_name, const void *pBuf,
                                 size_t buf_size, const void *pComment,
                                 mz_uint16 comment_size,
                                 mz_uint level_and_flags, mz_uint64 uncomp_size,
                                 mz_uint32 uncomp_crc32) {
  mz_uint32 ext_attributes = 0;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0;
  mz_uint level, num_alignment_padding_bytes;
  mz_uint64 local_dir_header_ofs, cur_archive_file_ofs, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  tdefl_compressor *pComp = NULL;
  mz_bool store_data_uncompressed;
  mz_zip_internal_state *pState;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;
  store_data_uncompressed =
      ((!level) || (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA));

  if ((!pZip) || (!pZip->m_pState) ||
      (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || ((buf_size) && (!pBuf)) ||
      (!pArchive_name) || ((comment_size) && (!pComment)) ||
      (pZip->m_total_files == 0xFFFF) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;

  local_dir_header_ofs = cur_archive_file_ofs = pZip->m_archive_size;
  pState = pZip->m_pState;

  if ((!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (uncomp_size))
    return MZ_FALSE;
  // No zip64 support yet
  if ((buf_size > 0xFFFFFFFF) || (uncomp_size > 0xFFFFFFFF))
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

#ifndef MINIZ_NO_TIME
  {
    time_t cur_time;
    time(&cur_time);
    mz_zip_time_t_to_dos_time(cur_time, &dos_time, &dos_date);
  }
#endif // #ifndef MINIZ_NO_TIME

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
        comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if ((archive_name_size) && (pArchive_name[archive_name_size - 1] == '/')) {
    // Set DOS Subdirectory attribute bit.
    ext_attributes |= 0x10;
    // Subdirectories cannot contain data.
    if ((buf_size) || (uncomp_size))
      return MZ_FALSE;
  }

  // Try to do any allocations before writing to the archive, so if an
  // allocation fails the file remains unmodified. (A good idea if we're doing
  // an in-place modification.)
  if ((!mz_zip_array_ensure_room(pZip, &pState->m_central_dir,
                                 MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                                     archive_name_size + comment_size)) ||
      (!mz_zip_array_ensure_room(pZip, &pState->m_central_dir_offsets, 1)))
    return MZ_FALSE;

  if ((!store_data_uncompressed) && (buf_size)) {
    if (NULL == (pComp = (tdefl_compressor *)pZip->m_pAlloc(
                     pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor))))
      return MZ_FALSE;
  }

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs,
                                 num_alignment_padding_bytes +
                                     sizeof(local_dir_header))) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }
  cur_archive_file_ofs +=
      num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name,
                     archive_name_size) != archive_name_size) {
    pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (!(level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
    uncomp_crc32 =
        (mz_uint32)mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf, buf_size);
    uncomp_size = buf_size;
    if (uncomp_size <= 3) {
      level = 0;
      store_data_uncompressed = MZ_TRUE;
    }
  }

  if (store_data_uncompressed) {
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pBuf,
                       buf_size) != buf_size) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    cur_archive_file_ofs += buf_size;
    comp_size = buf_size;

    if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
      method = MZ_DEFLATED;
  } else if (buf_size) {
    mz_zip_writer_add_state state;

    state.m_pZip = pZip;
    state.m_cur_archive_file_ofs = cur_archive_file_ofs;
    state.m_comp_size = 0;

    if ((tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state,
                    tdefl_create_comp_flags_from_zip_params(
                        level, -15, MZ_DEFAULT_STRATEGY)) !=
         TDEFL_STATUS_OKAY) ||
        (tdefl_compress_buffer(pComp, pBuf, buf_size, TDEFL_FINISH) !=
         TDEFL_STATUS_DONE)) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
      return MZ_FALSE;
    }

    comp_size = state.m_comp_size;
    cur_archive_file_ofs = state.m_cur_archive_file_ofs;

    method = MZ_DEFLATED;
  }

  pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
  pComp = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(
          pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size,
          comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header,
                     sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(
          pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment,
          comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0,
          dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}